

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4::LoadableGetStateBlock_x
          (ChElementTetraCorot_4 *this,int block_offset,ChState *mD)

{
  double *pdVar1;
  pointer psVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (block_offset < 0) goto LAB_0069d2f8;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar5 < block_offset) goto LAB_0069d2f8;
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar6 = 3;
  peVar4 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pdVar1 = pdVar3 + block_offset;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0069d17d;
  }
  else {
LAB_0069d17d:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  uVar6 = (ulong)(uint)block_offset;
  if (lVar5 < (long)(uVar6 + 3)) goto LAB_0069d2f8;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 3;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0069d1f0;
  }
  else {
LAB_0069d1f0:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 6)) goto LAB_0069d2f8;
  peVar4 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar3 + uVar6 + 6;
  uVar8 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0069d261;
  }
  else {
LAB_0069d261:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 9)) {
LAB_0069d2f8:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  peVar4 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar3 = pdVar3 + uVar6 + 9;
  uVar6 = 3;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_0069d2dc;
  }
  uVar8 = 0;
  do {
    pdVar3[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar8 * 8 + 0x20);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_0069d2dc:
  if (uVar6 < 3) {
    do {
      pdVar3[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementTetraCorot_4::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 6, 3) = nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = nodes[3]->GetPos().eigen();
}